

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O0

void R_Subsector(subsector_t *sub)

{
  sector_t *sec;
  bool bVar1;
  uint32 uVar2;
  uint uVar3;
  int iVar4;
  SDWORD SVar5;
  uint uVar6;
  secplane_t *psVar7;
  F3DFloor **ppFVar8;
  unsigned_short *puVar9;
  double dVar10;
  double dVar11;
  int local_3ac;
  visplane_t *local_348;
  visplane_t *local_328;
  int local_320;
  bool local_319;
  uint local_318;
  ushort local_312;
  uint i_3;
  FTextureID FStack_30c;
  WORD i_2;
  int shade;
  int local_304;
  double local_300;
  double fakeHeight_1;
  FTextureID local_2f0;
  uint i_1;
  double local_2e8;
  double fakeHeight;
  FTextureID local_2d8;
  int i;
  FTextureID local_2d0;
  FTextureID local_2cc;
  FTextureID local_2c8;
  FTextureID local_2c4;
  lightlist_t *local_2c0;
  lightlist_t *light;
  visplane_t *backupcp;
  visplane_t *backupfp;
  FSectorPortal *portal;
  int position;
  int cll;
  int fll;
  int iStack_28c;
  bool outersubsector;
  int ceilinglightlevel;
  int floorlightlevel;
  sector_t tempsec;
  seg_t *line;
  int count;
  subsector_t *sub_local;
  
  sector_t::sector_t((sector_t *)&ceilinglightlevel);
  cll._3_1_ = InSubsector == (subsector_t *)0x0;
  if (((bool)cll._3_1_) &&
     (InSubsector = sub, (long)numsubsectors <= ((long)sub - (long)subsectors) / 0x60)) {
    I_Error("R_Subsector: ss %ti with numss = %i",((long)sub - (long)subsectors) / 0x60,
            (ulong)(uint)numsubsectors);
  }
  if (sub->sector == (sector_t *)0x0) {
    __assert_fail("sub->sector != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_bsp.cpp"
                  ,0x42d,"void R_Subsector(subsector_t *)");
  }
  if (sub->polys != (FPolyNode *)0x0) {
    R_AddPolyobjs(sub);
    if ((cll._3_1_ & 1) == 0) {
      return;
    }
    InSubsector = (subsector_t *)0x0;
    return;
  }
  frontsector = sub->sector;
  frontsector->MoreFlags = frontsector->MoreFlags | 0x80;
  tempsec.vbocount = (int  [2])sub->firstline;
  frontsector = R_FakeFlat(frontsector,(sector_t *)&ceilinglightlevel,&stack0xfffffffffffffd74,&fll,
                           false);
  position = iStack_28c;
  portal._4_4_ = fll;
  local_319 = true;
  if (level.fadeto == 0) {
    uVar2 = PalEntry::operator_cast_to_unsigned_int(&frontsector->ColorMap->Fade);
    local_319 = true;
    if (uVar2 == 0) {
      local_319 = (level.flags & 8) != 0;
    }
  }
  foggy = local_319;
  if (local_319 == false) {
    local_320 = extralight << 4;
  }
  else {
    local_320 = 0;
  }
  r_actualextralight = local_320;
  if (((fixedlightlev < 0) && (frontsector->e != (extsector_t *)0x0)) &&
     (uVar3 = TArray<lightlist_t,_lightlist_t>::Size(&(frontsector->e->XFloor).lightlist),
     uVar3 != 0)) {
    local_2c0 = P_GetPlaneLight(frontsector,&frontsector->ceilingplane,false);
    basecolormap = local_2c0->extra_colormap;
    if (local_2c0->p_lightlevel != &frontsector->lightlevel) {
      fll = (int)*local_2c0->p_lightlevel;
    }
  }
  else {
    basecolormap = frontsector->ColorMap;
  }
  backupfp = (visplane_t *)sector_t::ValidatePortal(frontsector,1);
  iVar4 = secplane_t::PointOnSide(&frontsector->ceilingplane,&ViewPos);
  if (iVar4 < 1) {
    local_2c4 = sector_t::GetTexture(frontsector,1);
    bVar1 = FTextureID::operator==(&local_2c4,&skyflatnum);
    if ((bVar1) || (backupfp != (visplane_t *)0x0)) goto LAB_00384918;
    if ((frontsector->heightsec != (sector_t *)0x0) &&
       ((frontsector->heightsec->MoreFlags & 0x10) == 0)) {
      local_2c8 = sector_t::GetTexture(frontsector->heightsec,0);
      bVar1 = FTextureID::operator==(&local_2c8,&skyflatnum);
      if (bVar1) goto LAB_00384918;
    }
    local_328 = (visplane_t *)0x0;
  }
  else {
LAB_00384918:
    psVar7 = &frontsector->ceilingplane;
    local_2cc = sector_t::GetTexture(frontsector,1);
    iVar4 = fll + r_actualextralight;
    dVar10 = sector_t::GetAlpha(frontsector,1);
    uVar3 = sector_t::GetFlags(frontsector,1);
    local_328 = R_FindPlane(psVar7,local_2cc,iVar4,dVar10,(uVar3 & 4) != 0,
                            &frontsector->planes[1].xform,frontsector->sky,(FSectorPortal *)backupfp
                           );
  }
  ceilingplane = local_328;
  if (((fixedlightlev < 0) && (frontsector->e != (extsector_t *)0x0)) &&
     (uVar3 = TArray<lightlist_t,_lightlist_t>::Size(&(frontsector->e->XFloor).lightlist),
     uVar3 != 0)) {
    local_2c0 = P_GetPlaneLight(frontsector,&frontsector->floorplane,false);
    basecolormap = local_2c0->extra_colormap;
    if (local_2c0->p_lightlevel != &frontsector->lightlevel) {
      iStack_28c = (int)*local_2c0->p_lightlevel;
    }
  }
  else {
    basecolormap = frontsector->ColorMap;
  }
  backupfp = (visplane_t *)sector_t::ValidatePortal(frontsector,0);
  iVar4 = secplane_t::PointOnSide(&frontsector->floorplane,&ViewPos);
  if (iVar4 < 1) {
    local_2d0 = sector_t::GetTexture(frontsector,0);
    bVar1 = FTextureID::operator==(&local_2d0,&skyflatnum);
    if ((!bVar1) && (backupfp == (visplane_t *)0x0)) {
      if ((frontsector->heightsec != (sector_t *)0x0) &&
         ((frontsector->heightsec->MoreFlags & 0x10) == 0)) {
        i = (int)sector_t::GetTexture(frontsector->heightsec,1);
        bVar1 = FTextureID::operator==((FTextureID *)&i,&skyflatnum);
        if (bVar1) goto LAB_00384ba6;
      }
      local_348 = (visplane_t *)0x0;
      goto LAB_00384c70;
    }
  }
LAB_00384ba6:
  psVar7 = &frontsector->floorplane;
  local_2d8 = sector_t::GetTexture(frontsector,0);
  iVar4 = iStack_28c + r_actualextralight;
  dVar10 = sector_t::GetAlpha(frontsector,0);
  uVar3 = sector_t::GetFlags(frontsector,0);
  local_348 = R_FindPlane(psVar7,local_2d8,iVar4,dVar10,(uVar3 & 4) != 0,(FTransform *)frontsector,
                          frontsector->sky,(FSectorPortal *)backupfp);
LAB_00384c70:
  floorplane = local_348;
  iVar4 = FIntCVar::operator_cast_to_int(&r_3dfloors);
  if (((iVar4 != 0) && (frontsector->e != (extsector_t *)0x0)) &&
     (uVar3 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                        ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor), uVar3 != 0)) {
    backupcp = floorplane;
    light = (lightlist_t *)ceilingplane;
    for (fakeHeight._4_4_ = 0; iVar4 = fakeHeight._4_4_,
        uVar3 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor),
        iVar4 < (int)uVar3; fakeHeight._4_4_ = fakeHeight._4_4_ + 1) {
      ppFVar8 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor,
                           (long)fakeHeight._4_4_);
      fakeFloor = *ppFVar8;
      if ((((fakeFloor->flags & 1) != 0) && (fakeFloor->model != (sector_t *)0x0)) &&
         (bVar1 = secplane_t::isSlope((fakeFloor->bottom).plane), !bVar1)) {
        if (((fakeFloor->flags & 0x20) == 0) || ((fakeFloor->flags & 0xc) != 0)) {
          R_3D_AddHeight((fakeFloor->top).plane,frontsector);
        }
        if ((((fakeFloor->flags & 8) != 0) && (fakeFloor->alpha != 0)) &&
           (((fakeFloor->flags & 0x40000000) == 0 || ((fakeFloor->flags & 0x400000) == 0)))) {
          SVar5 = Scale(fakeFloor->alpha,0x10000,0xff);
          fakeAlpha = MIN<int>(SVar5,0x10000);
          if (fakeFloor->validcount != validcount) {
            fakeFloor->validcount = validcount;
            R_3D_NewClip();
          }
          dVar10 = secplane_t::ZatPoint((fakeFloor->top).plane,&frontsector->centerspot);
          local_2e8 = dVar10;
          if ((dVar10 < ViewPos.Z) &&
             (dVar11 = secplane_t::ZatPoint(&frontsector->floorplane,&frontsector->centerspot),
             dVar11 < dVar10)) {
            fake3D = 1;
            sector_t::operator=((sector_t *)&ceilinglightlevel,fakeFloor->model);
            secplane_t::operator=((secplane_t *)&tempsec.planes[1].TexZ,(fakeFloor->top).plane);
            secplane_t::operator=((secplane_t *)&tempsec.floorplane.negiC,(fakeFloor->bottom).plane)
            ;
            if (((fakeFloor->flags & 0x40000000) == 0) && ((fakeFloor->flags & 0x400000) == 0)) {
              i_1 = (uint)sector_t::GetTexture((sector_t *)&ceilinglightlevel,1);
              sector_t::SetTexture((sector_t *)&ceilinglightlevel,0,(FTextureID)i_1,true);
              portal._0_4_ = 1;
            }
            else {
              portal._0_4_ = 0;
            }
            frontsector = (sector_t *)&ceilinglightlevel;
            if ((fixedlightlev < 0) &&
               (uVar3 = TArray<lightlist_t,_lightlist_t>::Size(&(sub->sector->e->XFloor).lightlist),
               uVar3 != 0)) {
              local_2c0 = P_GetPlaneLight(sub->sector,&frontsector->floorplane,false);
              basecolormap = local_2c0->extra_colormap;
              iStack_28c = (int)*local_2c0->p_lightlevel;
            }
            ceilingplane = (visplane_t *)0x0;
            psVar7 = &frontsector->floorplane;
            local_2f0 = sector_t::GetTexture(frontsector,0);
            iVar4 = iStack_28c + r_actualextralight;
            dVar10 = sector_t::GetAlpha(frontsector,0);
            floorplane = R_FindPlane(psVar7,local_2f0,iVar4,dVar10,
                                     (fakeFloor->flags & 0x10000000) != 0,
                                     &frontsector->planes[(int)portal].xform,frontsector->sky,
                                     (FSectorPortal *)0x0);
            R_FakeDrawLoop(sub);
            fake3D = 0;
            frontsector = sub->sector;
          }
        }
      }
    }
    for (fakeHeight_1._4_4_ = 0; uVar3 = fakeHeight_1._4_4_,
        uVar6 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor), uVar3 < uVar6
        ; fakeHeight_1._4_4_ = fakeHeight_1._4_4_ + 1) {
      ppFVar8 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor,
                           (ulong)fakeHeight_1._4_4_);
      fakeFloor = *ppFVar8;
      if ((((fakeFloor->flags & 1) != 0) && (fakeFloor->model != (sector_t *)0x0)) &&
         (bVar1 = secplane_t::isSlope((fakeFloor->top).plane), !bVar1)) {
        if (((fakeFloor->flags & 0x20) == 0) || ((fakeFloor->flags & 0xc) != 0)) {
          R_3D_AddHeight((fakeFloor->bottom).plane,frontsector);
        }
        if ((((fakeFloor->flags & 8) != 0) && (fakeFloor->alpha != 0)) &&
           (((fakeFloor->flags & 0x40000000) != 0 || ((fakeFloor->flags & 0x400010) != 0x400010))))
        {
          SVar5 = Scale(fakeFloor->alpha,0x10000,0xff);
          fakeAlpha = MIN<int>(SVar5,0x10000);
          if (fakeFloor->validcount != validcount) {
            fakeFloor->validcount = validcount;
            R_3D_NewClip();
          }
          dVar10 = secplane_t::ZatPoint((fakeFloor->bottom).plane,&frontsector->centerspot);
          local_300 = dVar10;
          if ((ViewPos.Z < dVar10) &&
             (dVar11 = secplane_t::ZatPoint(&frontsector->ceilingplane,&frontsector->centerspot),
             dVar10 < dVar11)) {
            fake3D = 2;
            sector_t::operator=((sector_t *)&ceilinglightlevel,fakeFloor->model);
            secplane_t::operator=((secplane_t *)&tempsec.planes[1].TexZ,(fakeFloor->top).plane);
            secplane_t::operator=((secplane_t *)&tempsec.floorplane.negiC,(fakeFloor->bottom).plane)
            ;
            if ((((fakeFloor->flags & 0x40000000) == 0) && ((fakeFloor->flags & 0x400000) == 0)) ||
               (((fakeFloor->flags & 0x40000000) != 0 && ((fakeFloor->flags & 0x400000) != 0)))) {
              local_304 = (int)sector_t::GetTexture((sector_t *)&ceilinglightlevel,0);
              sector_t::SetTexture((sector_t *)&ceilinglightlevel,1,(FTextureID)local_304,true);
              portal._0_4_ = 0;
            }
            else {
              portal._0_4_ = 1;
            }
            frontsector = (sector_t *)&ceilinglightlevel;
            secplane_t::ChangeHeight((secplane_t *)&tempsec.floorplane.negiC,-1.52587890625e-05);
            if ((fixedlightlev < 0) &&
               (uVar3 = TArray<lightlist_t,_lightlist_t>::Size(&(sub->sector->e->XFloor).lightlist),
               uVar3 != 0)) {
              local_2c0 = P_GetPlaneLight(sub->sector,&frontsector->ceilingplane,false);
              basecolormap = local_2c0->extra_colormap;
              fll = (int)*local_2c0->p_lightlevel;
            }
            secplane_t::ChangeHeight((secplane_t *)&tempsec.floorplane.negiC,1.52587890625e-05);
            floorplane = (visplane_t *)0x0;
            psVar7 = &frontsector->ceilingplane;
            shade = (int)sector_t::GetTexture(frontsector,1);
            iVar4 = fll + r_actualextralight;
            dVar10 = sector_t::GetAlpha(frontsector,1);
            ceilingplane = R_FindPlane(psVar7,(FTextureID)shade,iVar4,dVar10,
                                       (fakeFloor->flags & 0x10000000) != 0,
                                       &frontsector->planes[(int)portal].xform,frontsector->sky,
                                       (FSectorPortal *)0x0);
            R_FakeDrawLoop(sub);
            fake3D = 0;
            frontsector = sub->sector;
          }
        }
      }
    }
    fakeFloor = (F3DFloor *)0x0;
    floorplane = backupcp;
    ceilingplane = (visplane_t *)light;
  }
  basecolormap = frontsector->ColorMap;
  iStack_28c = position;
  fll = portal._4_4_;
  sec = sub->sector;
  FStack_30c = sector_t::GetTexture(frontsector,1);
  bVar1 = FTextureID::operator==(&stack0xfffffffffffffcf4,&skyflatnum);
  if (bVar1) {
    local_3ac = fll;
  }
  else {
    local_3ac = iStack_28c;
  }
  R_AddSprites(sec,local_3ac,(uint)FakeSide);
  if ((uint)(((long)sub - (long)subsectors) / 0x60) < (uint)numsubsectors) {
    iVar4 = (iStack_28c + fll) / 2 + r_actualextralight;
    puVar9 = TArray<unsigned_short,_unsigned_short>::operator[]
                       (&ParticlesInSubsec,((long)sub - (long)subsectors) / 0x60 & 0xffffffff);
    for (local_312 = *puVar9; local_312 != 0xffff; local_312 = Particles[local_312].snext) {
      R_ProjectParticle(Particles + (int)(uint)local_312,
                        subsectors[((long)sub - (long)subsectors) / 0x60].sector,
                        (iVar4 + 0xc) * -0x4000 + 0x400000,(uint)FakeSide);
    }
  }
  tempsec.vbocount = (int  [2])sub->firstline;
  line._4_4_ = sub->numlines;
  while (line._4_4_ != 0) {
    if ((((cll._3_1_ & 1) == 0) || (*(long *)((long)tempsec.vbocount + 0x10) == 0)) ||
       ((*(byte *)(*(long *)((long)tempsec.vbocount + 0x10) + 0xb4) & 0x40) == 0)) {
      iVar4 = FIntCVar::operator_cast_to_int(&r_3dfloors);
      if (((iVar4 != 0) && (*(long *)((long)tempsec.vbocount + 0x28) != 0)) &&
         ((frontsector->e != (extsector_t *)0x0 &&
          (uVar3 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                             ((TArray<F3DFloor_*,_F3DFloor_*> *)
                              (*(long *)(*(long *)((long)tempsec.vbocount + 0x28) + 0x200) + 0x70)),
          uVar3 != 0)))) {
        backupcp = floorplane;
        light = (lightlist_t *)ceilingplane;
        floorplane = (visplane_t *)0x0;
        ceilingplane = (visplane_t *)0x0;
        for (local_318 = 0;
            uVar3 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                              ((TArray<F3DFloor_*,_F3DFloor_*> *)
                               (*(long *)(*(long *)((long)tempsec.vbocount + 0x28) + 0x200) + 0x70))
            , local_318 < uVar3; local_318 = local_318 + 1) {
          ppFVar8 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                              ((TArray<F3DFloor_*,_F3DFloor_*> *)
                               (*(long *)(*(long *)((long)tempsec.vbocount + 0x28) + 0x200) + 0x70),
                               (ulong)local_318);
          fakeFloor = *ppFVar8;
          if ((((fakeFloor->flags & 1) != 0) && ((fakeFloor->flags & 8) != 0)) &&
             (fakeFloor->model != (sector_t *)0x0)) {
            fake3D = 4;
            sector_t::operator=((sector_t *)&ceilinglightlevel,fakeFloor->model);
            secplane_t::operator=((secplane_t *)&tempsec.planes[1].TexZ,(fakeFloor->top).plane);
            secplane_t::operator=((secplane_t *)&tempsec.floorplane.negiC,(fakeFloor->bottom).plane)
            ;
            backsector = (sector_t *)&ceilinglightlevel;
            if (fakeFloor->validcount != validcount) {
              fakeFloor->validcount = validcount;
              R_3D_NewClip();
            }
            R_AddLine((seg_t *)tempsec.vbocount);
          }
        }
        fakeFloor = (F3DFloor *)0x0;
        fake3D = 0;
        floorplane = backupcp;
        ceilingplane = (visplane_t *)light;
      }
      R_AddLine((seg_t *)tempsec.vbocount);
    }
    tempsec.vbocount = (int  [2])((long)tempsec.vbocount + 0x48);
    line._4_4_ = line._4_4_ - 1;
  }
  if ((cll._3_1_ & 1) != 0) {
    InSubsector = (subsector_t *)0x0;
  }
  return;
}

Assistant:

void R_Subsector (subsector_t *sub)
{
	int 		 count;
	seg_t*		 line;
	sector_t     tempsec;				// killough 3/7/98: deep water hack
	int          floorlightlevel;		// killough 3/16/98: set floor lightlevel
	int          ceilinglightlevel;		// killough 4/11/98
	bool		 outersubsector;
	int	fll, cll, position;
	FSectorPortal *portal;

	// kg3D - fake floor stuff
	visplane_t *backupfp;
	visplane_t *backupcp;
	//secplane_t templane;
	lightlist_t *light;

	if (InSubsector != NULL)
	{ // InSubsector is not NULL. This means we are rendering from a mini-BSP.
		outersubsector = false;
	}
	else
	{
		outersubsector = true;
		InSubsector = sub;
	}

#ifdef RANGECHECK
	if (outersubsector && sub - subsectors >= (ptrdiff_t)numsubsectors)
		I_Error ("R_Subsector: ss %ti with numss = %i", sub - subsectors, numsubsectors);
#endif

	assert(sub->sector != NULL);

	if (sub->polys)
	{ // Render the polyobjs in the subsector first
		R_AddPolyobjs(sub);
		if (outersubsector)
		{
			InSubsector = NULL;
		}
		return;
	}

	frontsector = sub->sector;
	frontsector->MoreFlags |= SECF_DRAWN;
	count = sub->numlines;
	line = sub->firstline;

	// killough 3/8/98, 4/4/98: Deep water / fake ceiling effect
	frontsector = R_FakeFlat(frontsector, &tempsec, &floorlightlevel,
						   &ceilinglightlevel, false);	// killough 4/11/98

	fll = floorlightlevel;
	cll = ceilinglightlevel;

	// [RH] set foggy flag
	foggy = level.fadeto || frontsector->ColorMap->Fade || (level.flags & LEVEL_HASFADETABLE);
	r_actualextralight = foggy ? 0 : extralight << 4;

	// kg3D - fake lights
	if (fixedlightlev < 0 && frontsector->e && frontsector->e->XFloor.lightlist.Size())
	{
		light = P_GetPlaneLight(frontsector, &frontsector->ceilingplane, false);
		basecolormap = light->extra_colormap;
		// If this is the real ceiling, don't discard plane lighting R_FakeFlat()
		// accounted for.
		if (light->p_lightlevel != &frontsector->lightlevel)
		{
			ceilinglightlevel = *light->p_lightlevel;
		}
	}
	else
	{
		basecolormap = frontsector->ColorMap;
	}

	portal = frontsector->ValidatePortal(sector_t::ceiling);

	ceilingplane = frontsector->ceilingplane.PointOnSide(ViewPos) > 0 ||
		frontsector->GetTexture(sector_t::ceiling) == skyflatnum ||
		portal != NULL ||
		(frontsector->heightsec && 
		 !(frontsector->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC) &&
		 frontsector->heightsec->GetTexture(sector_t::floor) == skyflatnum) ?
		R_FindPlane(frontsector->ceilingplane,		// killough 3/8/98
					frontsector->GetTexture(sector_t::ceiling),
					ceilinglightlevel + r_actualextralight,				// killough 4/11/98
					frontsector->GetAlpha(sector_t::ceiling),
					!!(frontsector->GetFlags(sector_t::ceiling) & PLANEF_ADDITIVE),
					frontsector->planes[sector_t::ceiling].xform,
					frontsector->sky,
					portal
					) : NULL;

	if (fixedlightlev < 0 && frontsector->e && frontsector->e->XFloor.lightlist.Size())
	{
		light = P_GetPlaneLight(frontsector, &frontsector->floorplane, false);
		basecolormap = light->extra_colormap;
		// If this is the real floor, don't discard plane lighting R_FakeFlat()
		// accounted for.
		if (light->p_lightlevel != &frontsector->lightlevel)
		{
			floorlightlevel = *light->p_lightlevel;
		}
	}
	else
	{
		basecolormap = frontsector->ColorMap;
	}

	// killough 3/7/98: Add (x,y) offsets to flats, add deep water check
	// killough 3/16/98: add floorlightlevel
	// killough 10/98: add support for skies transferred from sidedefs
	portal = frontsector->ValidatePortal(sector_t::floor);

	floorplane = frontsector->floorplane.PointOnSide(ViewPos) > 0 || // killough 3/7/98
		frontsector->GetTexture(sector_t::floor) == skyflatnum ||
		portal != NULL ||
		(frontsector->heightsec &&
		 !(frontsector->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC) &&
		 frontsector->heightsec->GetTexture(sector_t::ceiling) == skyflatnum) ?
		R_FindPlane(frontsector->floorplane,
					frontsector->GetTexture(sector_t::floor),
					floorlightlevel + r_actualextralight,				// killough 3/16/98
					frontsector->GetAlpha(sector_t::floor),
					!!(frontsector->GetFlags(sector_t::floor) & PLANEF_ADDITIVE),
					frontsector->planes[sector_t::floor].xform,
					frontsector->sky,
					portal
					) : NULL;

	// kg3D - fake planes rendering
	if (r_3dfloors && frontsector->e && frontsector->e->XFloor.ffloors.Size())
	{
		backupfp = floorplane;
		backupcp = ceilingplane;
		// first check all floors
		for (int i = 0; i < (int)frontsector->e->XFloor.ffloors.Size(); i++)
		{
			fakeFloor = frontsector->e->XFloor.ffloors[i];
			if (!(fakeFloor->flags & FF_EXISTS)) continue;
			if (!fakeFloor->model) continue;
			if (fakeFloor->bottom.plane->isSlope()) continue;
			if (!(fakeFloor->flags & FF_NOSHADE) || (fakeFloor->flags & (FF_RENDERPLANES|FF_RENDERSIDES)))
			{
				R_3D_AddHeight(fakeFloor->top.plane, frontsector);
			}
			if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
			if (fakeFloor->alpha == 0) continue;
			if (fakeFloor->flags & FF_THISINSIDE && fakeFloor->flags & FF_INVERTSECTOR) continue;
			fakeAlpha = MIN<fixed_t>(Scale(fakeFloor->alpha, OPAQUE, 255), OPAQUE);
			if (fakeFloor->validcount != validcount)
			{
				fakeFloor->validcount = validcount;
				R_3D_NewClip();
			}
			double fakeHeight = fakeFloor->top.plane->ZatPoint(frontsector->centerspot);
			if (fakeHeight < ViewPos.Z &&
				fakeHeight > frontsector->floorplane.ZatPoint(frontsector->centerspot))
			{
				fake3D = FAKE3D_FAKEFLOOR;
				tempsec = *fakeFloor->model;
				tempsec.floorplane = *fakeFloor->top.plane;
				tempsec.ceilingplane = *fakeFloor->bottom.plane;
				if (!(fakeFloor->flags & FF_THISINSIDE) && !(fakeFloor->flags & FF_INVERTSECTOR))
				{
					tempsec.SetTexture(sector_t::floor, tempsec.GetTexture(sector_t::ceiling));
					position = sector_t::ceiling;
				} else position = sector_t::floor;
				frontsector = &tempsec;

				if (fixedlightlev < 0 && sub->sector->e->XFloor.lightlist.Size())
				{
					light = P_GetPlaneLight(sub->sector, &frontsector->floorplane, false);
					basecolormap = light->extra_colormap;
					floorlightlevel = *light->p_lightlevel;
				}

				ceilingplane = NULL;
				floorplane = R_FindPlane(frontsector->floorplane,
					frontsector->GetTexture(sector_t::floor),
					floorlightlevel + r_actualextralight,				// killough 3/16/98
					frontsector->GetAlpha(sector_t::floor),
					!!(fakeFloor->flags & FF_ADDITIVETRANS),
					frontsector->planes[position].xform,
					frontsector->sky,
					NULL);

				R_FakeDrawLoop(sub);
				fake3D = 0;
				frontsector = sub->sector;
			}
		}
		// and now ceilings
		for (unsigned int i = 0; i < frontsector->e->XFloor.ffloors.Size(); i++)
		{
			fakeFloor = frontsector->e->XFloor.ffloors[i];
			if (!(fakeFloor->flags & FF_EXISTS)) continue;
			if (!fakeFloor->model) continue;
			if (fakeFloor->top.plane->isSlope()) continue;
			if (!(fakeFloor->flags & FF_NOSHADE) || (fakeFloor->flags & (FF_RENDERPLANES|FF_RENDERSIDES)))
			{
				R_3D_AddHeight(fakeFloor->bottom.plane, frontsector);
			}
			if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
			if (fakeFloor->alpha == 0) continue;
			if (!(fakeFloor->flags & FF_THISINSIDE) && (fakeFloor->flags & (FF_SWIMMABLE|FF_INVERTSECTOR)) == (FF_SWIMMABLE|FF_INVERTSECTOR)) continue;
			fakeAlpha = MIN<fixed_t>(Scale(fakeFloor->alpha, OPAQUE, 255), OPAQUE);

			if (fakeFloor->validcount != validcount)
			{
				fakeFloor->validcount = validcount;
				R_3D_NewClip();
			}
			double fakeHeight = fakeFloor->bottom.plane->ZatPoint(frontsector->centerspot);
			if (fakeHeight > ViewPos.Z &&
				fakeHeight < frontsector->ceilingplane.ZatPoint(frontsector->centerspot))
			{
				fake3D = FAKE3D_FAKECEILING;
				tempsec = *fakeFloor->model;
				tempsec.floorplane = *fakeFloor->top.plane;
				tempsec.ceilingplane = *fakeFloor->bottom.plane;
				if ((!(fakeFloor->flags & FF_THISINSIDE) && !(fakeFloor->flags & FF_INVERTSECTOR)) ||
					(fakeFloor->flags & FF_THISINSIDE && fakeFloor->flags & FF_INVERTSECTOR))
				{
					tempsec.SetTexture(sector_t::ceiling, tempsec.GetTexture(sector_t::floor));
					position = sector_t::floor;
				} else position = sector_t::ceiling;
				frontsector = &tempsec;

				tempsec.ceilingplane.ChangeHeight(-1 / 65536.);
				if (fixedlightlev < 0 && sub->sector->e->XFloor.lightlist.Size())
				{
					light = P_GetPlaneLight(sub->sector, &frontsector->ceilingplane, false);
					basecolormap = light->extra_colormap;
					ceilinglightlevel = *light->p_lightlevel;
				}
				tempsec.ceilingplane.ChangeHeight(1 / 65536.);

				floorplane = NULL;
				ceilingplane = R_FindPlane(frontsector->ceilingplane,		// killough 3/8/98
					frontsector->GetTexture(sector_t::ceiling),
					ceilinglightlevel + r_actualextralight,				// killough 4/11/98
					frontsector->GetAlpha(sector_t::ceiling),
					!!(fakeFloor->flags & FF_ADDITIVETRANS),
					frontsector->planes[position].xform,
					frontsector->sky,
					NULL);

				R_FakeDrawLoop(sub);
				fake3D = 0;
				frontsector = sub->sector;
			}
		}
		fakeFloor = NULL;
		floorplane = backupfp;
		ceilingplane = backupcp;
	}

	basecolormap = frontsector->ColorMap;
	floorlightlevel = fll;
	ceilinglightlevel = cll;

	// killough 9/18/98: Fix underwater slowdown, by passing real sector 
	// instead of fake one. Improve sprite lighting by basing sprite
	// lightlevels on floor & ceiling lightlevels in the surrounding area.
	// [RH] Handle sprite lighting like Duke 3D: If the ceiling is a sky, sprites are lit by
	// it, otherwise they are lit by the floor.
	R_AddSprites (sub->sector, frontsector->GetTexture(sector_t::ceiling) == skyflatnum ?
		ceilinglightlevel : floorlightlevel, FakeSide);

	// [RH] Add particles
	if ((unsigned int)(sub - subsectors) < (unsigned int)numsubsectors)
	{ // Only do it for the main BSP.
		int shade = LIGHT2SHADE((floorlightlevel + ceilinglightlevel)/2 + r_actualextralight);
		for (WORD i = ParticlesInSubsec[(unsigned int)(sub-subsectors)]; i != NO_PARTICLE; i = Particles[i].snext)
		{
			R_ProjectParticle (Particles + i, subsectors[sub-subsectors].sector, shade, FakeSide);
		}
	}

	count = sub->numlines;
	line = sub->firstline;

	while (count--)
	{
		if (!outersubsector || line->sidedef == NULL || !(line->sidedef->Flags & WALLF_POLYOBJ))
		{
			// kg3D - fake planes bounding calculation
			if (r_3dfloors && line->backsector && frontsector->e && line->backsector->e->XFloor.ffloors.Size())
			{
				backupfp = floorplane;
				backupcp = ceilingplane;
				floorplane = NULL;
				ceilingplane = NULL;
				for (unsigned int i = 0; i < line->backsector->e->XFloor.ffloors.Size(); i++)
				{
					fakeFloor = line->backsector->e->XFloor.ffloors[i];
					if (!(fakeFloor->flags & FF_EXISTS)) continue;
					if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
					if (!fakeFloor->model) continue;
					fake3D = FAKE3D_FAKEBACK;
					tempsec = *fakeFloor->model;
					tempsec.floorplane = *fakeFloor->top.plane;
					tempsec.ceilingplane = *fakeFloor->bottom.plane;
					backsector = &tempsec;
					if (fakeFloor->validcount != validcount)
					{
						fakeFloor->validcount = validcount;
						R_3D_NewClip();
					}
					R_AddLine(line); // fake
				}
				fakeFloor = NULL;
				fake3D = 0;
				floorplane = backupfp;
				ceilingplane = backupcp;
			}
			R_AddLine (line); // now real
		}
		line++;
	}
	if (outersubsector)
	{
		InSubsector = NULL;
	}
}